

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O2

CURLcode Curl_loadhostpairs(Curl_easy *data)

{
  undefined1 *puVar1;
  char cVar2;
  curl_slist *pcVar3;
  curl_trc_feat *pcVar4;
  int iVar5;
  CURLcode CVar6;
  Curl_hash *h;
  size_t sVar7;
  Curl_addrinfo *pCVar8;
  void *pvVar9;
  Curl_dns_entry *pCVar10;
  char *pcVar11;
  Curl_addrinfo *pCVar12;
  curl_slist **ppcVar13;
  size_t in_R8;
  Curl_addrinfo *pCVar14;
  curl_off_t port;
  Curl_str source;
  char *host;
  Curl_addrinfo *local_1a8;
  Curl_hash *local_1a0;
  char *local_198;
  curl_slist **local_190;
  Curl_str target;
  curl_off_t num;
  char entry_id [262];
  
  h = &dnscache_get(data)->entries;
  if (h == (Curl_hash *)0x0) {
    CVar6 = CURLE_FAILED_INIT;
  }
  else {
    puVar1 = &(data->state).field_0x7c0;
    *puVar1 = *puVar1 & 0xfb;
    ppcVar13 = &(data->state).resolve;
    local_190 = ppcVar13;
    while (pcVar3 = *ppcVar13, pcVar3 != (curl_slist *)0x0) {
      host = pcVar3->data;
      if (host != (char *)0x0) {
        if (*host == '-') {
          num = 0;
          host = host + 1;
          iVar5 = Curl_str_single(&host,'[');
          if (iVar5 == 0) {
            iVar5 = Curl_str_until(&host,&source,0x2e,']');
            if (iVar5 != 0) goto LAB_00130c56;
            iVar5 = Curl_str_single(&host,']');
          }
          else {
            iVar5 = Curl_str_until(&host,&source,0x1000,':');
          }
          if (((iVar5 == 0) && (iVar5 = Curl_str_single(&host,':'), iVar5 == 0)) &&
             (iVar5 = Curl_str_number(&host,&num,0xffff), iVar5 == 0)) {
            sVar7 = create_dnscache_id(source.str,CONCAT44(source.len._4_4_,(uint)source.len),
                                       (int)num,entry_id,in_R8);
            dnscache_lock(data,(Curl_dnscache *)h);
            Curl_hash_delete(h,entry_id,sVar7 + 1);
            dnscache_unlock(data,(Curl_dnscache *)h);
          }
        }
        else {
          port = 0;
          cVar2 = *host;
          if (cVar2 == '+') {
            host = host + 1;
          }
          iVar5 = Curl_str_single(&host,'[');
          if (iVar5 == 0) {
            iVar5 = Curl_str_until(&host,&source,0x2e,']');
            if (iVar5 != 0) goto LAB_00130c56;
            iVar5 = Curl_str_single(&host,']');
          }
          else {
            iVar5 = Curl_str_until(&host,&source,0x1000,':');
          }
          if (iVar5 == 0) {
            iVar5 = Curl_str_single(&host,':');
            if (((iVar5 != 0) || (iVar5 = Curl_str_number(&host,&port,0xffff), iVar5 != 0)) ||
               (iVar5 = Curl_str_single(&host,':'), iVar5 != 0)) {
LAB_00130cf1:
              pCVar14 = (Curl_addrinfo *)0x0;
LAB_00130cbf:
              Curl_failf(data,"Couldn\'t parse CURLOPT_RESOLVE entry \'%s\'",pcVar3->data);
              Curl_freeaddrinfo(pCVar14);
              return CURLE_SETOPT_OPTION_SYNTAX;
            }
            local_198 = host;
            local_1a8 = (Curl_addrinfo *)0x0;
            pCVar12 = (Curl_addrinfo *)0x0;
            pCVar14 = local_1a8;
            local_1a0 = h;
LAB_00130962:
            do {
              local_1a8 = pCVar14;
              pCVar14 = local_1a8;
              if (*host == '\0') break;
              iVar5 = Curl_str_single(&host,'[');
              if (iVar5 == 0) {
                iVar5 = Curl_str_until(&host,&target,0x2e,']');
                pCVar14 = local_1a8;
                if ((iVar5 != 0) ||
                   (iVar5 = Curl_str_single(&host,']'), pCVar14 = local_1a8, iVar5 != 0))
                goto LAB_00130cbf;
              }
              else {
                iVar5 = Curl_str_until(&host,&target,0x1000,',');
                if (iVar5 != 0) {
                  iVar5 = Curl_str_single(&host,',');
                  pCVar14 = local_1a8;
                  if (iVar5 != 0) goto LAB_00130cbf;
                  goto LAB_00130962;
                }
              }
              sVar7 = target.len;
              pCVar14 = local_1a8;
              if (0x3f < target.len) goto LAB_00130cbf;
              memcpy(&num,target.str,target.len);
              *(undefined1 *)((long)&num + sVar7) = 0;
              pCVar8 = Curl_str2addr((char *)&num,(int)port);
              if (pCVar8 == (Curl_addrinfo *)0x0) {
                pCVar14 = local_1a8;
                if (((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) &&
                   ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
                    (0 < pcVar4->log_level)))) {
                  Curl_infof(data,"Resolve address \'%s\' found illegal",&num);
                  pCVar14 = local_1a8;
                }
                goto LAB_00130cbf;
              }
              pCVar14 = pCVar8;
              if (pCVar12 != (Curl_addrinfo *)0x0) {
                pCVar12->ai_next = pCVar8;
                pCVar14 = local_1a8;
              }
              iVar5 = Curl_str_single(&host,',');
              pCVar12 = pCVar8;
            } while (iVar5 == 0);
            if (pCVar14 == (Curl_addrinfo *)0x0) goto LAB_00130cf1;
            sVar7 = create_dnscache_id(source.str,CONCAT44(source.len._4_4_,(uint)source.len),
                                       (int)port,entry_id,in_R8);
            h = local_1a0;
            dnscache_lock(data,(Curl_dnscache *)local_1a0);
            pvVar9 = Curl_hash_pick(h,entry_id,sVar7 + 1);
            if (pvVar9 != (void *)0x0) {
              if (((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) &&
                 ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar4->log_level)))) {
                Curl_infof(data,"RESOLVE %.*s:%ld - old addresses discarded",(ulong)(uint)source.len
                           ,source.str,port);
              }
              h = local_1a0;
              Curl_hash_delete(local_1a0,entry_id,sVar7 + 1);
            }
            in_R8 = CONCAT44(source.len._4_4_,(uint)source.len);
            pCVar10 = dnscache_add_addr(data,(Curl_dnscache *)h,pCVar14,source.str,in_R8,(int)port,
                                        cVar2 != '+');
            if (pCVar10 == (Curl_dns_entry *)0x0) {
              dnscache_unlock(data,(Curl_dnscache *)h);
              return CURLE_OUT_OF_MEMORY;
            }
            pCVar10->refcount = pCVar10->refcount - 1;
            dnscache_unlock(data,(Curl_dnscache *)h);
            if (((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) &&
               ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
                (0 < pcVar4->log_level)))) {
              pcVar11 = " (non-permanent)";
              if (cVar2 != '+') {
                pcVar11 = "";
              }
              in_R8 = port;
              Curl_infof(data,"Added %.*s:%ld:%s to DNS cache%s",(ulong)(uint)source.len,source.str,
                         port,local_198,pcVar11);
            }
            iVar5 = Curl_str_casecompare(&source,"*");
            if (iVar5 != 0) {
              if (((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) &&
                 ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar4->log_level)))) {
                Curl_infof(data,"RESOLVE *:%ld using wildcard",port);
              }
              puVar1 = &(data->state).field_0x7c0;
              *puVar1 = *puVar1 | 4;
            }
          }
        }
      }
LAB_00130c56:
      ppcVar13 = &pcVar3->next;
    }
    *local_190 = (curl_slist *)0x0;
    CVar6 = CURLE_OK;
  }
  return CVar6;
}

Assistant:

CURLcode Curl_loadhostpairs(struct Curl_easy *data)
{
  struct Curl_dnscache *dnscache = dnscache_get(data);
  struct curl_slist *hostp;

  if(!dnscache)
    return CURLE_FAILED_INIT;

  /* Default is no wildcard found */
  data->state.wildcard_resolve = FALSE;

  for(hostp = data->state.resolve; hostp; hostp = hostp->next) {
    char entry_id[MAX_HOSTCACHE_LEN];
    const char *host = hostp->data;
    struct Curl_str source;
    if(!host)
      continue;
    if(*host == '-') {
      curl_off_t num = 0;
      size_t entry_len;
      host++;
      if(!Curl_str_single(&host, '[')) {
        if(Curl_str_until(&host, &source, MAX_IPADR_LEN, ']') ||
           Curl_str_single(&host, ']') ||
           Curl_str_single(&host, ':'))
          continue;
      }
      else {
        if(Curl_str_until(&host, &source, 4096, ':') ||
           Curl_str_single(&host, ':')) {
          continue;
        }
      }

      if(!Curl_str_number(&host, &num, 0xffff)) {
        /* Create an entry id, based upon the hostname and port */
        entry_len = create_dnscache_id(Curl_str(&source),
                                       Curl_strlen(&source), (int)num,
                                       entry_id, sizeof(entry_id));
        dnscache_lock(data, dnscache);
        /* delete entry, ignore if it did not exist */
        Curl_hash_delete(&dnscache->entries, entry_id, entry_len + 1);
        dnscache_unlock(data, dnscache);
      }
    }
    else {
      struct Curl_dns_entry *dns;
      struct Curl_addrinfo *head = NULL, *tail = NULL;
      size_t entry_len;
      char address[64];
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      const char *addresses = NULL;
#endif
      curl_off_t port = 0;
      bool permanent = TRUE;
      bool error = TRUE;

      if(*host == '+') {
        host++;
        permanent = FALSE;
      }
      if(!Curl_str_single(&host, '[')) {
        if(Curl_str_until(&host, &source, MAX_IPADR_LEN, ']') ||
           Curl_str_single(&host, ']'))
          continue;
      }
      else {
        if(Curl_str_until(&host, &source, 4096, ':'))
          continue;
      }
      if(Curl_str_single(&host, ':') ||
         Curl_str_number(&host, &port, 0xffff) ||
         Curl_str_single(&host, ':'))
        goto err;

#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      addresses = host;
#endif

      /* start the address section */
      while(*host) {
        struct Curl_str target;
        struct Curl_addrinfo *ai;

        if(!Curl_str_single(&host, '[')) {
          if(Curl_str_until(&host, &target, MAX_IPADR_LEN, ']') ||
             Curl_str_single(&host, ']'))
            goto err;
        }
        else {
          if(Curl_str_until(&host, &target, 4096, ',')) {
            if(Curl_str_single(&host, ','))
              goto err;
            /* survive nothing but just a comma */
            continue;
          }
        }
#ifndef USE_IPV6
        if(memchr(target.str, ':', target.len)) {
          infof(data, "Ignoring resolve address '%s', missing IPv6 support.",
                address);
          if(Curl_str_single(&host, ','))
            goto err;
          continue;
        }
#endif

        if(Curl_strlen(&target) >= sizeof(address))
          goto err;

        memcpy(address, Curl_str(&target), Curl_strlen(&target));
        address[Curl_strlen(&target)] = '\0';

        ai = Curl_str2addr(address, (int)port);
        if(!ai) {
          infof(data, "Resolve address '%s' found illegal", address);
          goto err;
        }

        if(tail) {
          tail->ai_next = ai;
          tail = tail->ai_next;
        }
        else {
          head = tail = ai;
        }
        if(Curl_str_single(&host, ','))
          break;
      }

      if(!head)
        goto err;

      error = FALSE;
err:
      if(error) {
        failf(data, "Couldn't parse CURLOPT_RESOLVE entry '%s'",
              hostp->data);
        Curl_freeaddrinfo(head);
        return CURLE_SETOPT_OPTION_SYNTAX;
      }

      /* Create an entry id, based upon the hostname and port */
      entry_len = create_dnscache_id(Curl_str(&source), Curl_strlen(&source),
                                     (int)port,
                                     entry_id, sizeof(entry_id));

      dnscache_lock(data, dnscache);

      /* See if it is already in our dns cache */
      dns = Curl_hash_pick(&dnscache->entries, entry_id, entry_len + 1);

      if(dns) {
        infof(data, "RESOLVE %.*s:%" CURL_FORMAT_CURL_OFF_T
              " - old addresses discarded", (int)Curl_strlen(&source),
              Curl_str(&source), port);
        /* delete old entry, there are two reasons for this
         1. old entry may have different addresses.
         2. even if entry with correct addresses is already in the cache,
            but if it is close to expire, then by the time next http
            request is made, it can get expired and pruned because old
            entry is not necessarily marked as permanent.
         3. when adding a non-permanent entry, we want it to remove and
            replace an existing permanent entry.
         4. when adding a non-permanent entry, we want it to get a "fresh"
            timeout that starts _now_. */

        Curl_hash_delete(&dnscache->entries, entry_id, entry_len + 1);
      }

      /* put this new host in the cache */
      dns = dnscache_add_addr(data, dnscache, head, Curl_str(&source),
                              Curl_strlen(&source), (int)port, permanent);
      if(dns) {
        /* release the returned reference; the cache itself will keep the
         * entry alive: */
        dns->refcount--;
      }

      dnscache_unlock(data, dnscache);

      if(!dns)
        return CURLE_OUT_OF_MEMORY;

#ifndef CURL_DISABLE_VERBOSE_STRINGS
      infof(data, "Added %.*s:%" CURL_FORMAT_CURL_OFF_T ":%s to DNS cache%s",
            (int)Curl_strlen(&source), Curl_str(&source), port, addresses,
            permanent ? "" : " (non-permanent)");
#endif

      /* Wildcard hostname */
      if(Curl_str_casecompare(&source, "*")) {
        infof(data, "RESOLVE *:%" CURL_FORMAT_CURL_OFF_T " using wildcard",
              port);
        data->state.wildcard_resolve = TRUE;
      }
    }
  }
  data->state.resolve = NULL; /* dealt with now */

  return CURLE_OK;
}